

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchInitRegsBinary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar4 = uVar6;
  }
  while (iVar5 = (int)uVar6, iVar5 < pAig->nRegs) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar5);
    pvVar3 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar2 + 0x24));
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = Saig_SynchTernary(*(uint *)((long)pvVar2 + 0x18) >> 4 & 1);
      *(uint *)((long)pvVar3 + uVar6 * 4) = uVar1;
    }
    uVar6 = (ulong)(iVar5 + 1);
  }
  return;
}

Assistant:

void Saig_SynchInitRegsBinary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pObj->fMarkA );
    }
}